

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialalignment.cpp
# Opt level: O1

bool __thiscall Alignment::CalculateMean(Alignment *this)

{
  Vector3d *pVVar1;
  pointer pMVar2;
  pointer pMVar3;
  ActualDstType actualDst;
  ostream *poVar4;
  pointer pMVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  double dVar11;
  undefined1 auVar10 [16];
  double dVar12;
  undefined1 auVar13 [16];
  
  lVar6 = 0;
  do {
    this->Mean[lVar6].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = 0.0;
    this->Mean[lVar6].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = 0.0;
    this->Mean[lVar6].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = 0.0;
    pVVar1 = this->Mean + lVar6;
    pMVar2 = this->OriginData[lVar6].
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar3 = this->OriginData[lVar6].
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar2 != pMVar3) {
      dVar9 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0];
      dVar11 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[1];
      dVar12 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
      pMVar5 = pMVar2;
      do {
        dVar9 = dVar9 + (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[0];
        dVar11 = dVar11 + (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data.array[1];
        dVar12 = dVar12 + (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data.array[2];
        (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[0] = dVar9;
        (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[1] = dVar11;
        (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[2] = dVar12;
        pMVar5 = pMVar5 + 1;
      } while (pMVar5 != pMVar3);
    }
    lVar7 = ((long)pMVar3 - (long)pMVar2 >> 3) * -0x5555555555555555;
    auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar13._0_8_ = lVar7;
    auVar13._12_4_ = 0x45300000;
    dVar12 = (auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
    auVar10._8_8_ = dVar12;
    auVar10._0_8_ = dVar12;
    auVar13 = divpd(*(undefined1 (*) [16])
                     (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array,auVar10);
    *(undefined1 (*) [16])
     (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array =
         auVar13;
    (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2]
         = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2] / dVar12;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar8 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar8);
  return !bVar8;
}

Assistant:

bool Alignment::CalculateMean()
{
    for(int i = 0; i < 2; ++i)
    {
        this->Mean[i] = Vector3d::Zero();
        try
        {
            for(auto data : this->OriginData[i])
            {
                this->Mean[i][0] += (data[0]);
                this->Mean[i][1] += (data[1]);
                this->Mean[i][2] += (data[2]);
            }
            this->Mean[i] /= this->OriginData[i].size();
            cout << OriginData[i].size() << endl; 
        }
        catch(const std::exception& e)
        {
            std::cout << e.what() << '\n';
            return false;
        }
    }
    return true;
}